

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

void bcf_hdr_check_sanity(bcf_hdr_t *hdr)

{
  uint uVar1;
  
  if (bcf_hdr_check_sanity_PL_warned == '\0') {
    uVar1 = bcf_hdr_id2int(hdr,0,"PL");
    if ((-1 < (int)uVar1) &&
       (uVar1 = (hdr->id[0][uVar1].val)->info[2], (uVar1 & 0xf00) != 0x300 && (~uVar1 & 0xf) != 0))
    {
      bcf_hdr_check_sanity_cold_1();
    }
  }
  uVar1 = bcf_hdr_id2int(hdr,2,"GL");
  if ((-1 < (int)uVar1) &&
     (uVar1 = (hdr->id[0][uVar1].val)->info[2], (uVar1 & 0xf00) != 0x300 && (~uVar1 & 0xf) != 0)) {
    bcf_hdr_check_sanity_cold_2();
  }
  return;
}

Assistant:

void bcf_hdr_check_sanity(bcf_hdr_t *hdr)
{
    static int PL_warned = 0, GL_warned = 0;

    if ( !PL_warned )
    {
        int id = bcf_hdr_id2int(hdr, BCF_DT_ID, "PL");
        if ( bcf_hdr_idinfo_exists(hdr,BCF_HL_FMT,id) && bcf_hdr_id2length(hdr,BCF_HL_FMT,id)!=BCF_VL_G )
        {
            fprintf(stderr,"[W::%s] PL should be declared as Number=G\n", __func__);
            PL_warned = 1;
        }
    }
    if ( !GL_warned )
    {
        int id = bcf_hdr_id2int(hdr, BCF_HL_FMT, "GL");
        if ( bcf_hdr_idinfo_exists(hdr,BCF_HL_FMT,id) && bcf_hdr_id2length(hdr,BCF_HL_FMT,id)!=BCF_VL_G )
        {
            fprintf(stderr,"[W::%s] GL should be declared as Number=G\n", __func__);
            PL_warned = 1;
        }
    }
}